

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_unicode.c
# Opt level: O0

PHYSFS_uint32 utf16codepoint(PHYSFS_uint16 **_str)

{
  ushort *puVar1;
  uint uVar2;
  uint local_24;
  PHYSFS_uint32 pair;
  PHYSFS_uint32 cp;
  PHYSFS_uint16 *src;
  PHYSFS_uint16 **_str_local;
  
  puVar1 = *_str;
  _pair = puVar1 + 1;
  local_24 = (uint)*puVar1;
  if (local_24 == 0) {
    _str_local._4_4_ = 0;
  }
  else {
    if ((local_24 < 0xdc00) || (0xdfff < local_24)) {
      if ((0xd7ff < local_24) && (local_24 < 0xdc00)) {
        uVar2 = (uint)*_pair;
        if (uVar2 == 0) {
          local_24 = 0x3f;
        }
        else if ((uVar2 < 0xdc00) || (0xdfff < uVar2)) {
          local_24 = 0x3f;
        }
        else {
          _pair = puVar1 + 2;
          local_24 = (local_24 - 0xd800) * 0x400 | uVar2 - 0xdc00;
        }
      }
    }
    else {
      local_24 = 0x3f;
    }
    *_str = _pair;
    _str_local._4_4_ = local_24;
  }
  return _str_local._4_4_;
}

Assistant:

static PHYSFS_uint32 utf16codepoint(const PHYSFS_uint16 **_str)
{
    const PHYSFS_uint16 *src = *_str;
    PHYSFS_uint32 cp = (PHYSFS_uint32) *(src++);

    if (cp == 0)  /* null terminator, end of string. */
        return 0;
    /* Orphaned second half of surrogate pair? */
    else if ((cp >= 0xDC00) && (cp <= 0xDFFF))
        cp = UNICODE_BOGUS_CHAR_CODEPOINT;
    else if ((cp >= 0xD800) && (cp <= 0xDBFF))  /* start surrogate pair! */
    {
        const PHYSFS_uint32 pair = (PHYSFS_uint32) *src;
        if (pair == 0)
            cp = UNICODE_BOGUS_CHAR_CODEPOINT;
        else if ((pair < 0xDC00) || (pair > 0xDFFF))
            cp = UNICODE_BOGUS_CHAR_CODEPOINT;
        else
        {
            src++;  /* eat the other surrogate. */
            cp = (((cp - 0xD800) << 10) | (pair - 0xDC00));
        } /* else */
    } /* else if */

    *_str = src;
    return cp;
}